

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

_Bool array_container_contains(array_container_t *arr,uint16_t pos)

{
  ushort uVar1;
  int iVar2;
  _Bool _Var3;
  int iVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  
  iVar4 = arr->cardinality + -1;
  uVar5 = 0;
  do {
    if (iVar4 < (int)(uVar5 + 0x10)) {
      if (iVar4 < (int)uVar5) {
        return false;
      }
      _Var3 = true;
      lVar6 = 0;
      do {
        uVar1 = arr->array[(ulong)uVar5 + lVar6];
        _Var3 = (_Bool)(_Var3 & uVar1 <= pos | uVar1 == pos);
        if (pos <= uVar1) {
          return _Var3;
        }
        lVar6 = lVar6 + 1;
      } while ((iVar4 - uVar5) + 1 != (int)lVar6);
      return false;
    }
    uVar7 = uVar5 + iVar4 >> 1;
    uVar1 = *(ushort *)((long)arr->array + (ulong)(uVar5 + iVar4 & 0xfffffffe));
    iVar2 = uVar7 - 1;
    if (uVar1 <= pos) {
      iVar2 = iVar4;
    }
    uVar7 = uVar7 + 1;
    if (pos <= uVar1) {
      uVar7 = uVar5;
      iVar4 = iVar2;
    }
    uVar5 = uVar7;
  } while (uVar1 != pos);
  return true;
}

Assistant:

inline bool array_container_contains(const array_container_t *arr,
                                     uint16_t pos) {
    //    return binarySearch(arr->array, arr->cardinality, pos) >= 0;
    // binary search with fallback to linear search for short ranges
    int32_t low = 0;
    const uint16_t *carr = (const uint16_t *)arr->array;
    int32_t high = arr->cardinality - 1;
    //    while (high - low >= 0) {
    while (high >= low + 16) {
        int32_t middleIndex = (low + high) >> 1;
        uint16_t middleValue = carr[middleIndex];
        if (middleValue < pos) {
            low = middleIndex + 1;
        } else if (middleValue > pos) {
            high = middleIndex - 1;
        } else {
            return true;
        }
    }

    for (int i = low; i <= high; i++) {
        uint16_t v = carr[i];
        if (v == pos) {
            return true;
        }
        if (v > pos) return false;
    }
    return false;
}